

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void DBaseDecal::SpreadRight(double r,side_t *feelwall,double wallsize,F3DFloor *ffloor)

{
  side_t *feelwall_00;
  side_t **ppsVar1;
  uint uVar2;
  bool bVar3;
  uint local_5c;
  int i;
  side_t *nextwall;
  double ldy;
  double ldx;
  double y;
  double x;
  vertex_t *v1;
  F3DFloor *ffloor_local;
  double wallsize_local;
  side_t *feelwall_local;
  double r_local;
  
  v1 = (vertex_t *)ffloor;
  ffloor_local = (F3DFloor *)wallsize;
  wallsize_local = (double)feelwall;
  feelwall_local = (side_t *)r;
  TArray<side_t_*,_side_t_*>::Push(&SpreadStack,(side_t **)&wallsize_local);
  do {
    bVar3 = false;
    if ((double)ffloor_local < (double)feelwall_local) {
      bVar3 = *(int *)((long)wallsize_local + 0xac) != -1;
    }
    if (!bVar3) {
      return;
    }
    wallsize_local = (double)(sides + *(uint *)((long)wallsize_local + 0xac));
    feelwall_00 = NextWall((side_t *)wallsize_local);
    if ((feelwall_00 != (side_t *)0x0) && (feelwall_00->LeftSide != 0xffffffff)) {
      local_5c = TArray<side_t_*,_side_t_*>::Size(&SpreadStack);
      do {
        uVar2 = local_5c - 1;
        if ((int)local_5c < 1) break;
        ppsVar1 = TArray<side_t_*,_side_t_*>::operator[](&SpreadStack,(long)(int)uVar2);
        local_5c = uVar2;
      } while (*ppsVar1 != feelwall_00);
      if (uVar2 == 0xffffffff) {
        SpreadRight((double)feelwall_local,feelwall_00,(double)ffloor_local,(F3DFloor *)v1);
      }
    }
    feelwall_local =
         (side_t *)(((DecalWidth - (double)feelwall_local) + (double)ffloor_local) - DecalLeft);
    GetWallStuff((side_t *)wallsize_local,(vertex_t **)&x,&ldy,(double *)&nextwall);
    y = vertex_t::fX((vertex_t *)x);
    ldx = vertex_t::fY((vertex_t *)x);
    ffloor_local = (F3DFloor *)Length(ldy,(double)nextwall);
    y = y - ((double)feelwall_local * ldy) / (double)ffloor_local;
    ldx = ldx - ((double)feelwall_local * (double)nextwall) / (double)ffloor_local;
    feelwall_local = (side_t *)(DecalRight - (double)feelwall_local);
    (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[9])
              (y,ldx,SpreadZ,SpreadSource,SpreadTemplate,wallsize_local,v1);
    TArray<side_t_*,_side_t_*>::Push(&SpreadStack,(side_t **)&wallsize_local);
  } while( true );
}

Assistant:

void DBaseDecal::SpreadRight (double r, side_t *feelwall, double wallsize, F3DFloor *ffloor)
{
	vertex_t *v1;
	double x, y, ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r > wallsize && feelwall->RightSide != NO_SIDE)
	{
		feelwall = &sides[feelwall->RightSide];

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				SpreadRight (r, nextwall, wallsize, ffloor);
			}
		}

		r = DecalWidth - r + wallsize - DecalLeft;
		GetWallStuff (feelwall, v1, ldx, ldy);
		x = v1->fX();
		y = v1->fY();
		wallsize = Length (ldx, ldy);
		x -= r*ldx / wallsize;
		y -= r*ldy / wallsize;
		r = DecalRight - r;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);
	}
}